

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O1

rtr_socket * create_socket(_Bool is_resetting)

{
  long lVar1;
  tr_socket *ptVar2;
  rtr_socket *prVar3;
  aspa_table *aspa_table;
  spki_table *spki_table;
  pfx_table *pfx_table;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = (tr_socket *)lrtr_calloc(1,0x38);
  ptVar2->recv_fp = custom_recv;
  ptVar2->send_fp = custom_send;
  prVar3 = (rtr_socket *)lrtr_calloc(1,0x80);
  if (prVar3 == (rtr_socket *)0x0) {
    __assert_fail("socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x3ea,"struct rtr_socket *create_socket(_Bool)");
  }
  prVar3->is_resetting = is_resetting;
  prVar3->version = 2;
  prVar3->state = RTR_SYNC;
  prVar3->tr_socket = ptVar2;
  aspa_table = (aspa_table *)lrtr_malloc(0x80);
  if (aspa_table != (aspa_table *)0x0) {
    aspa_table_init(aspa_table,aspa_update_callback);
    prVar3->aspa_table = aspa_table;
    spki_table = (spki_table *)lrtr_malloc(0x170);
    spki_table_init(spki_table,(spki_update_fp)0x0);
    prVar3->spki_table = spki_table;
    pfx_table = (pfx_table *)lrtr_malloc(0x50);
    pfx_table_init(pfx_table,(pfx_update_fp)0x0);
    prVar3->pfx_table = pfx_table;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return prVar3;
    }
    __stack_chk_fail();
  }
  __assert_fail("aspa_table",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                ,0x3f2,"struct rtr_socket *create_socket(_Bool)");
}

Assistant:

static struct rtr_socket *create_socket(bool is_resetting)
{
	struct tr_socket *tr_socket = lrtr_calloc(1, sizeof(struct tr_socket));

	tr_socket->recv_fp = (tr_recv_fp)&custom_recv;
	tr_socket->send_fp = (tr_send_fp)&custom_send;

	struct rtr_socket *socket = lrtr_calloc(1, sizeof(struct rtr_socket));

	assert(socket);
	socket->is_resetting = is_resetting;
	socket->version = 2;
	socket->state = RTR_SYNC;
	socket->tr_socket = tr_socket;

	struct aspa_table *aspa_table = lrtr_malloc(sizeof(struct aspa_table));

	assert(aspa_table);
	aspa_table_init(aspa_table, aspa_update_callback);
	socket->aspa_table = aspa_table;

	struct spki_table *spki_table = lrtr_malloc(sizeof(struct spki_table));

	spki_table_init(spki_table, NULL);
	socket->spki_table = spki_table;

	struct pfx_table *pfx_table = lrtr_malloc(sizeof(struct pfx_table));

	pfx_table_init(pfx_table, NULL);
	socket->pfx_table = pfx_table;

	return socket;
}